

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O2

Value __thiscall jbcoin::STPathSet::getJson(STPathSet *this,int options)

{
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *pvVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *__x;
  Value VVar3;
  undefined1 local_50 [16];
  STPath it;
  
  Json::Value::Value((Value *)this,arrayValue);
  pvVar1 = *(vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> **)
            (CONCAT44(in_register_00000034,options) + 0x18);
  uVar2 = extraout_RDX;
  for (__x = *(vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> **)
              (CONCAT44(in_register_00000034,options) + 0x10); __x != pvVar1; __x = __x + 1) {
    std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::vector
              ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)&it,__x);
    STPath::getJson((STPath *)local_50,
                    (int)(_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                          *)&it);
    Json::Value::append((Value *)this,(Value *)local_50);
    Json::Value::~Value((Value *)local_50);
    std::_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::~_Vector_base
              ((_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)&it);
    uVar2 = extraout_RDX_00;
  }
  VVar3._8_8_ = uVar2;
  VVar3.value_.map_ = (ObjectValues *)this;
  return VVar3;
}

Assistant:

Json::Value
STPathSet::getJson (int options) const
{
    Json::Value ret (Json::arrayValue);
    for (auto it: value)
        ret.append (it.getJson (options));

    return ret;
}